

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_IteratorClose(JSContext *ctx,JSValue enum_obj,BOOL is_exception_pending)

{
  JSRuntime *pJVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  JSValue JVar6;
  int local_48;
  ulong local_40;
  int64_t local_38;
  
  if (is_exception_pending == 0) {
    local_38 = 3;
    local_48 = 0;
    local_40 = 0;
    uVar5 = 0;
  }
  else {
    pJVar1 = ctx->rt;
    pvVar2 = (pJVar1->current_exception).u.ptr;
    local_38 = (pJVar1->current_exception).tag;
    (pJVar1->current_exception).u.int32 = 0;
    uVar5 = (ulong)pvVar2 & 0xffffffff00000000;
    (pJVar1->current_exception).tag = 2;
    local_40 = (ulong)pvVar2 & 0xffffffff;
    local_48 = -1;
  }
  JVar6 = JS_GetPropertyInternal(ctx,enum_obj,6,enum_obj,0);
  iVar3 = (int)JVar6.tag;
  iVar4 = local_48;
  if (((iVar3 != 2) && (iVar3 != 3)) && (iVar4 = -1, iVar3 != 6)) {
    JVar6 = JS_CallFree(ctx,JVar6,enum_obj,0,(JSValue *)0x0);
    if (((is_exception_pending == 0) && ((int)JVar6.tag != -1)) &&
       (local_48 = -1, (int)JVar6.tag != 6)) {
      JS_ThrowTypeErrorNotAnObject(ctx);
    }
    JS_FreeValue(ctx,JVar6);
    iVar4 = local_48;
  }
  if (is_exception_pending != 0) {
    JVar6.tag = local_38;
    JVar6.u.ptr = (void *)(uVar5 | local_40);
    JS_Throw(ctx,JVar6);
  }
  return iVar4;
}

Assistant:

static int JS_IteratorClose(JSContext *ctx, JSValueConst enum_obj,
                            BOOL is_exception_pending)
{
    JSValue method, ret, ex_obj;
    int res;

    if (is_exception_pending) {
        ex_obj = ctx->rt->current_exception;
        ctx->rt->current_exception = JS_NULL;
        res = -1;
    } else {
        ex_obj = JS_UNDEFINED;
        res = 0;
    }
    method = JS_GetProperty(ctx, enum_obj, JS_ATOM_return);
    if (JS_IsException(method)) {
        res = -1;
        goto done;
    }
    if (JS_IsUndefined(method) || JS_IsNull(method)) {
        goto done;
    }
    ret = JS_CallFree(ctx, method, enum_obj, 0, NULL);
    if (!is_exception_pending) {
        if (JS_IsException(ret)) {
            res = -1;
        } else if (!JS_IsObject(ret)) {
            JS_ThrowTypeErrorNotAnObject(ctx);
            res = -1;
        }
    }
    JS_FreeValue(ctx, ret);
 done:
    if (is_exception_pending) {
        JS_Throw(ctx, ex_obj);
    }
    return res;
}